

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_qmfb.c
# Opt level: O0

void jpc_qmfb_split_colgrp(jpc_fix_t *a,uint numrows,uint stride,uint parity)

{
  uint uVar1;
  ulong num_arrays;
  uint uStack_80078;
  uint uStack_80074;
  uint i_2;
  uint n_2;
  uint i_1;
  uint n_1;
  uint i;
  uint n;
  uint m;
  uint hstartrow;
  size_t bufsize;
  jpc_fix_t *dstptr2;
  jpc_fix_t *srcptr2;
  jpc_fix_t *dstptr;
  jpc_fix_t *srcptr;
  jpc_fix_t *buf;
  jpc_fix_t splitbuf [65536];
  uint parity_local;
  uint stride_local;
  uint numrows_local;
  jpc_fix_t *a_local;
  
  srcptr = (jpc_fix_t *)&buf;
  num_arrays = (ulong)(numrows + 1 >> 1);
  if ((0x1000 < num_arrays) &&
     (srcptr = (jpc_fix_t *)jas_alloc3(num_arrays,0x10,8), srcptr == (jpc_fix_t *)0x0)) {
    abort();
  }
  if (1 < numrows) {
    uVar1 = (numrows + 1) - parity >> 1;
    srcptr2 = srcptr;
    dstptr = a + (1 - parity) * stride;
    uStack_80074 = numrows - uVar1;
    for (n_1 = uStack_80074; n_1 != 0; n_1 = n_1 - 1) {
      bufsize = (size_t)srcptr2;
      dstptr2 = dstptr;
      for (i_1 = 0; i_1 < 0x10; i_1 = i_1 + 1) {
        *(jpc_fix_t *)bufsize = *dstptr2;
        bufsize = bufsize + 8;
        dstptr2 = dstptr2 + 1;
      }
      srcptr2 = srcptr2 + 0x10;
      dstptr = dstptr + (stride << 1);
    }
    srcptr2 = a + (1 - parity) * stride;
    dstptr = a + (2 - parity) * stride;
    for (n_2 = (numrows - uStack_80074) - (uint)((parity != 0 ^ 0xffU) & 1); n_2 != 0; n_2 = n_2 - 1
        ) {
      bufsize = (size_t)srcptr2;
      dstptr2 = dstptr;
      for (i_2 = 0; i_2 < 0x10; i_2 = i_2 + 1) {
        *(jpc_fix_t *)bufsize = *dstptr2;
        bufsize = bufsize + 8;
        dstptr2 = dstptr2 + 1;
      }
      srcptr2 = srcptr2 + stride;
      dstptr = dstptr + (stride << 1);
    }
    srcptr2 = a + uVar1 * stride;
    dstptr = srcptr;
    for (; uStack_80074 != 0; uStack_80074 = uStack_80074 - 1) {
      bufsize = (size_t)srcptr2;
      dstptr2 = dstptr;
      for (uStack_80078 = 0; uStack_80078 < 0x10; uStack_80078 = uStack_80078 + 1) {
        *(jpc_fix_t *)bufsize = *dstptr2;
        bufsize = bufsize + 8;
        dstptr2 = dstptr2 + 1;
      }
      srcptr2 = srcptr2 + stride;
      dstptr = dstptr + 0x10;
    }
  }
  if ((jpc_fix_t **)srcptr != &buf) {
    jas_free(srcptr);
  }
  return;
}

Assistant:

static void jpc_qmfb_split_colgrp(jpc_fix_t *a, unsigned numrows, unsigned stride,
  unsigned parity)
{

	jpc_fix_t splitbuf[QMFB_SPLITBUFSIZE * JPC_QMFB_COLGRPSIZE];
	jpc_fix_t *buf = splitbuf;
	jpc_fix_t *srcptr;
	jpc_fix_t *dstptr;
	register jpc_fix_t *srcptr2;
	register jpc_fix_t *dstptr2;

	/* Get a buffer. */
	const size_t bufsize = JPC_CEILDIVPOW2(numrows, 1);
	if (bufsize > QMFB_SPLITBUFSIZE) {
		if (!(buf = jas_alloc3(bufsize, JPC_QMFB_COLGRPSIZE,
		  sizeof(jpc_fix_t)))) {
			/* We have no choice but to commit suicide in this case. */
			abort();
		}
	}

	if (numrows >= 2) {
		const unsigned hstartrow = (numrows + 1 - parity) >> 1;
		// ORIGINAL (WRONG): m = (parity) ? hstartrow : (numrows - hstartrow);
		const unsigned m = numrows - hstartrow;

		/* Save the samples destined for the highpass channel. */
		dstptr = buf;
		srcptr = &a[(1 - parity) * stride];
		for (unsigned n = m; n > 0; --n) {
			dstptr2 = dstptr;
			srcptr2 = srcptr;
			for (unsigned i = 0; i < JPC_QMFB_COLGRPSIZE; ++i) {
				*dstptr2 = *srcptr2;
				++dstptr2;
				++srcptr2;
			}
			dstptr += JPC_QMFB_COLGRPSIZE;
			srcptr += stride << 1;
		}
		/* Copy the appropriate samples into the lowpass channel. */
		dstptr = &a[(1 - parity) * stride];
		srcptr = &a[(2 - parity) * stride];
		for (unsigned n = numrows - m - (!parity); n > 0; --n) {
			dstptr2 = dstptr;
			srcptr2 = srcptr;
			for (unsigned i = 0; i < JPC_QMFB_COLGRPSIZE; ++i) {
				*dstptr2 = *srcptr2;
				++dstptr2;
				++srcptr2;
			}
			dstptr += stride;
			srcptr += stride << 1;
		}
		/* Copy the saved samples into the highpass channel. */
		dstptr = &a[hstartrow * stride];
		srcptr = buf;
		for (unsigned n = m; n > 0; --n) {
			dstptr2 = dstptr;
			srcptr2 = srcptr;
			for (unsigned i = 0; i < JPC_QMFB_COLGRPSIZE; ++i) {
				*dstptr2 = *srcptr2;
				++dstptr2;
				++srcptr2;
			}
			dstptr += stride;
			srcptr += JPC_QMFB_COLGRPSIZE;
		}
	}

	/* If the split buffer was allocated on the heap, free this memory. */
	if (buf != splitbuf) {
		jas_free(buf);
	}

}